

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS
ref_node_tet_dquality_dnode0(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality,REF_DBL *d_quality)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  REF_DBL *pRVar5;
  uint uVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined8 extraout_XMM0_Qb;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  REF_DBL det;
  REF_DBL temp;
  REF_DBL l5;
  REF_DBL l1;
  REF_DBL l0;
  REF_DBL l4;
  REF_DBL l3;
  REF_DBL l2;
  REF_DBL volume_1;
  REF_DBL det_1;
  REF_DBL volume;
  REF_DBL d_denom [3];
  REF_DBL d_num [3];
  REF_DBL jac [9];
  REF_DBL d_volume [3];
  REF_DBL d_volume_in_metric [3];
  REF_DBL d_l2 [3];
  REF_DBL d_l1 [3];
  REF_DBL d_l0 [3];
  double local_3c8;
  double dStack_3c0;
  double local_3b8;
  double local_3a8;
  undefined8 uStack_3a0;
  REF_DBL local_390;
  REF_DBL local_388;
  REF_DBL RStack_380;
  REF_DBL local_378;
  double local_368 [4];
  double local_348 [4];
  double local_328 [4];
  double local_308 [4];
  double local_2e8 [4];
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  double local_268;
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  double local_218;
  double dStack_210;
  double local_208;
  double local_1f8 [4];
  double local_1d8 [4];
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  undefined8 uStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  REF_DBL local_168 [10];
  REF_DBL local_118 [7];
  double local_e0 [5];
  REF_DBL local_b8;
  double local_b0 [5];
  REF_DBL local_88;
  double local_80 [5];
  REF_DBL local_58;
  double local_50 [5];
  
  if (ref_node->tet_quality == 2) {
    uVar6 = ref_node_tet_dvol_dnode0(ref_node,nodes,&local_228,&local_388);
    if (uVar6 == 0) {
      if (local_228 <= ref_node->min_volume) {
        *quality = local_228 - ref_node->min_volume;
        d_quality[2] = local_378;
        local_118[0] = local_388;
        local_118[1] = RStack_380;
LAB_00178cd8:
        *d_quality = local_118[0];
        d_quality[1] = local_118[1];
        return 0;
      }
      iVar4 = *nodes;
      pRVar5 = ref_node->real;
      lVar8 = 0;
      do {
        (&local_b8)[lVar8 + 0xc] = pRVar5[iVar4 * 0xf + 9 + (int)lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      iVar4 = nodes[1];
      lVar8 = 0;
      do {
        (&local_b8)[lVar8 + 6] = pRVar5[iVar4 * 0xf + 9 + (int)lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      iVar4 = nodes[2];
      lVar8 = 0;
      do {
        (&local_b8)[lVar8] = pRVar5[iVar4 * 0xf + 9 + (int)lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      iVar4 = nodes[3];
      lVar8 = 0;
      do {
        local_118[lVar8] = pRVar5[iVar4 * 0xf + 9 + (int)lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      lVar8 = 0;
      do {
        dVar10 = (&local_b8)[lVar8 + 0xd];
        dVar12 = (&local_b8)[lVar8 + 7];
        dVar14 = (&local_b8)[lVar8 + 1];
        dVar11 = local_118[lVar8 + 1];
        local_e0[lVar8 + -1] =
             ((&local_b8)[lVar8 + 0xc] + (&local_b8)[lVar8 + 6] + (&local_b8)[lVar8] +
             local_118[lVar8]) * 0.25;
        local_e0[lVar8] = (dVar10 + dVar12 + dVar14 + dVar11) * 0.25;
        lVar8 = lVar8 + 2;
      } while (lVar8 != 6);
      uVar6 = ref_matrix_exp_m(local_118 + 6,local_1d8);
      if (uVar6 == 0) {
        uVar6 = ref_matrix_jacob_m(local_1d8,local_168);
        if (uVar6 == 0) {
          pRVar5 = ref_node->real;
          iVar4 = nodes[1];
          iVar1 = *nodes;
          lVar8 = 0;
          do {
            local_1f8[lVar8] = pRVar5[(long)iVar4 * 0xf + lVar8] - pRVar5[(long)iVar1 * 0xf + lVar8]
            ;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          iVar2 = nodes[2];
          lVar8 = 0;
          do {
            local_348[lVar8] = pRVar5[(long)iVar2 * 0xf + lVar8] - pRVar5[(long)iVar1 * 0xf + lVar8]
            ;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          iVar3 = nodes[3];
          lVar8 = 0;
          do {
            local_368[lVar8] = pRVar5[(long)iVar3 * 0xf + lVar8] - pRVar5[(long)iVar1 * 0xf + lVar8]
            ;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar8 = 0;
          do {
            local_2e8[lVar8] = pRVar5[(long)iVar2 * 0xf + lVar8] - pRVar5[(long)iVar4 * 0xf + lVar8]
            ;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar8 = 0;
          do {
            local_308[lVar8] = pRVar5[(long)iVar3 * 0xf + lVar8] - pRVar5[(long)iVar4 * 0xf + lVar8]
            ;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar8 = 0;
          do {
            local_328[lVar8] = pRVar5[(long)iVar3 * 0xf + lVar8] - pRVar5[(long)iVar2 * 0xf + lVar8]
            ;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          local_240 = local_1d8[0];
          local_230 = local_1d8[1];
          local_2c0 = local_1f8[0];
          local_2e8[3] = local_1f8[1];
          local_2c8 = local_1f8[2];
          local_248 = local_1d8[3];
          local_3a8 = local_1b8;
          local_2a8 = local_348[0];
          local_2b8 = local_348[1];
          local_2b0 = local_348[2];
          local_290 = local_368[0];
          local_2a0 = local_368[1];
          local_298 = local_368[2];
          local_278 = local_2e8[0];
          local_288 = local_2e8[1];
          local_280 = local_2e8[2];
          local_260 = local_308[0];
          local_270 = local_308[1];
          local_268 = local_308[2];
          local_250 = local_328[0];
          local_258 = local_328[1];
          local_238 = local_328[2];
          uVar6 = ref_matrix_vt_m_v_deriv(local_1d8,local_1f8,&local_390,&local_3c8);
          if (uVar6 == 0) {
            uVar6 = ref_matrix_vt_m_v_deriv(local_1d8,local_348,&local_390,&local_218);
            if (uVar6 == 0) {
              uVar6 = ref_matrix_vt_m_v_deriv(local_1d8,local_368,&local_390,&local_188);
              if (uVar6 == 0) {
                local_1a8 = (-local_3c8 - local_218) - local_188;
                dStack_1a0 = (-dStack_3c0 - dStack_210) - dStack_180;
                local_198 = (-local_3b8 - local_208) - local_178;
                uStack_190 = 0x8000000000000000;
                uVar6 = ref_matrix_det_m(local_1d8,&local_220);
                if (uVar6 == 0) {
                  dVar12 = (local_1b0 * local_238 + local_1d8[2] * local_250 + local_3a8 * local_258
                           ) * local_238 +
                           (local_1d8[2] * local_238 + local_240 * local_250 + local_230 * local_258
                           ) * local_250 +
                           (local_3a8 * local_238 + local_230 * local_250 + local_248 * local_258) *
                           local_258 +
                           (local_1b0 * local_268 + local_260 * local_1d8[2] + local_270 * local_3a8
                           ) * local_268 +
                           (local_1d8[2] * local_268 + local_240 * local_260 + local_230 * local_270
                           ) * local_260 +
                           (local_3a8 * local_268 + local_230 * local_260 + local_248 * local_270) *
                           local_270 +
                           (local_1b0 * local_280 + local_278 * local_1d8[2] + local_288 * local_3a8
                           ) * local_280 +
                           (local_1d8[2] * local_280 + local_240 * local_278 + local_230 * local_288
                           ) * local_278 +
                           (local_3a8 * local_280 + local_230 * local_278 + local_248 * local_288) *
                           local_288 +
                           (local_1b0 * local_298 + local_290 * local_1d8[2] + local_2a0 * local_3a8
                           ) * local_298 +
                           (local_1d8[2] * local_298 + local_240 * local_290 + local_230 * local_2a0
                           ) * local_290 +
                           (local_3a8 * local_298 + local_230 * local_290 + local_248 * local_2a0) *
                           local_2a0 +
                           (local_1b0 * local_2b0 + local_2a8 * local_1d8[2] + local_2b8 * local_3a8
                           ) * local_2b0 +
                           (local_1d8[2] * local_2b0 + local_240 * local_2a8 + local_230 * local_2b8
                           ) * local_2a8 +
                           (local_3a8 * local_2b0 + local_230 * local_2a8 + local_248 * local_2b8) *
                           local_2b8 +
                           (local_1b0 * local_2c8 +
                           local_2c0 * local_1d8[2] + local_2e8[3] * local_3a8) * local_2c8 +
                           (local_1d8[2] * local_2c8 +
                           local_240 * local_2c0 + local_230 * local_2e8[3]) * local_2c0 +
                           (local_3a8 * local_2c8 + local_230 * local_2c0 + local_2e8[3] * local_248
                           ) * local_2e8[3];
                  uStack_3a0 = 0;
                  if (local_220 < 0.0) {
                    local_3a8 = sqrt(local_220);
                    uStack_3a0 = extraout_XMM0_Qb;
                  }
                  else {
                    local_3a8 = SQRT(local_220);
                  }
                  dVar14 = local_228 * local_3a8;
                  dVar11 = pow(dVar14,0.6666666666666666);
                  dVar10 = pow(dVar14,-0.3333333333333333);
                  dVar14 = dVar12 * 1e+20;
                  if (dVar14 <= -dVar14) {
                    dVar14 = -dVar14;
                  }
                  dVar13 = -dVar11;
                  dVar15 = dVar11;
                  if (dVar11 <= dVar13) {
                    dVar15 = dVar13;
                  }
                  if (dVar15 < dVar14) {
                    local_3a8 = local_3a8 * dVar10 * 0.6666666666666666;
                    *quality = (dVar11 * 24.9610058766228) / dVar12;
                    dVar14 = dVar12 * dVar12;
                    auVar16._0_8_ =
                         (dVar12 * local_3a8 * local_388 + local_1a8 * dVar13) * 24.9610058766228;
                    auVar16._8_8_ =
                         (dVar12 * local_3a8 * RStack_380 + dStack_1a0 * dVar13) * 24.9610058766228;
                    auVar17._8_8_ = dVar14;
                    auVar17._0_8_ = dVar14;
                    auVar17 = divpd(auVar16,auVar17);
                    *(undefined1 (*) [16])d_quality = auVar17;
                    d_quality[2] = ((local_198 * dVar13 + local_378 * local_3a8 * dVar12) *
                                   24.9610058766228) / dVar14;
                    return 0;
                  }
LAB_00179c23:
                  *quality = -1.0;
                  *d_quality = 0.0;
                  d_quality[1] = 0.0;
                  d_quality[2] = 0.0;
                  return 0;
                }
                pcVar9 = "det(mavg)";
                uVar7 = 0x729;
              }
              else {
                pcVar9 = "d_e2";
                uVar7 = 0x724;
              }
            }
            else {
              pcVar9 = "d_e1";
              uVar7 = 0x723;
            }
          }
          else {
            pcVar9 = "d_e0";
            uVar7 = 0x722;
          }
        }
        else {
          pcVar9 = "jac";
          uVar7 = 0x709;
        }
      }
      else {
        pcVar9 = "exp";
        uVar7 = 0x708;
      }
    }
    else {
      pcVar9 = "vol";
      uVar7 = 0x6fb;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar7,
           "ref_node_tet_jac_dquality_dnode0",(ulong)uVar6,pcVar9);
    pcVar9 = "jac";
    uVar7 = 0x755;
  }
  else {
    if (ref_node->tet_quality != 1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x758,
             "ref_node_tet_dquality_dnode0","case not recognized");
      return 1;
    }
    uVar6 = ref_node_dratio_dnode0(ref_node,*nodes,nodes[1],local_348,&local_58);
    if (uVar6 == 0) {
      uVar6 = ref_node_dratio_dnode0(ref_node,*nodes,nodes[2],local_368,&local_88);
      if (uVar6 == 0) {
        uVar6 = ref_node_dratio_dnode0(ref_node,*nodes,nodes[3],local_2e8,&local_b8);
        if (uVar6 == 0) {
          uVar6 = ref_node_ratio(ref_node,nodes[1],nodes[2],local_308);
          if (uVar6 == 0) {
            uVar6 = ref_node_ratio(ref_node,nodes[1],nodes[3],local_328);
            if (uVar6 == 0) {
              uVar6 = ref_node_ratio(ref_node,nodes[2],nodes[3],&local_388);
              if (uVar6 == 0) {
                uVar6 = ref_node_tet_dvol_dnode0(ref_node,nodes,&local_218,local_118);
                if (uVar6 == 0) {
                  if (local_218 <= ref_node->min_volume) {
                    *quality = local_218 - ref_node->min_volume;
                    d_quality[2] = local_118[2];
                    goto LAB_00178cd8;
                  }
                  iVar4 = *nodes;
                  pRVar5 = ref_node->real;
                  lVar8 = 0;
                  do {
                    local_168[lVar8] = pRVar5[iVar4 * 0xf + 3 + (int)lVar8];
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 6);
                  uVar6 = ref_matrix_det_m(local_168,&local_3c8);
                  dVar12 = local_3c8;
                  if (uVar6 == 0) {
                    iVar4 = nodes[1];
                    pRVar5 = ref_node->real;
                    lVar8 = 0;
                    do {
                      local_168[lVar8] = pRVar5[iVar4 * 0xf + 3 + (int)lVar8];
                      lVar8 = lVar8 + 1;
                    } while (lVar8 != 6);
                    uVar6 = ref_matrix_det_m(local_168,&local_3c8);
                    dVar14 = local_3c8;
                    if (uVar6 == 0) {
                      iVar4 = nodes[2];
                      pRVar5 = ref_node->real;
                      lVar8 = 0;
                      do {
                        local_168[lVar8] = pRVar5[iVar4 * 0xf + 3 + (int)lVar8];
                        lVar8 = lVar8 + 1;
                      } while (lVar8 != 6);
                      uVar6 = ref_matrix_det_m(local_168,&local_3c8);
                      dVar11 = local_3c8;
                      if (uVar6 == 0) {
                        if (dVar14 <= dVar12) {
                          dVar12 = dVar14;
                        }
                        iVar4 = nodes[3];
                        pRVar5 = ref_node->real;
                        lVar8 = 0;
                        do {
                          local_168[lVar8] = pRVar5[iVar4 * 0xf + 3 + (int)lVar8];
                          lVar8 = lVar8 + 1;
                        } while (lVar8 != 6);
                        uVar6 = ref_matrix_det_m(local_168,&local_3c8);
                        if (uVar6 == 0) {
                          if (dVar11 <= dVar12) {
                            dVar12 = dVar11;
                          }
                          if (local_3c8 <= dVar12) {
                            dVar12 = local_3c8;
                          }
                          dVar14 = SQRT(dVar12);
                          local_3a8 = dVar14;
                          if (dVar12 < 0.0) {
                            local_3a8 = sqrt(dVar12);
                          }
                          lVar8 = 0;
                          do {
                            dVar11 = dVar14;
                            if (dVar12 < 0.0) {
                              dVar11 = sqrt(dVar12);
                            }
                            local_e0[lVar8 + -1] = dVar11 * local_118[lVar8];
                            lVar8 = lVar8 + 1;
                          } while (lVar8 != 3);
                          dVar12 = local_218 * local_3a8;
                          dVar14 = pow(dVar12,0.6666666666666666);
                          lVar8 = 0;
                          do {
                            dVar11 = pow(dVar12,-0.3333333333333333);
                            local_1d8[lVar8] = dVar11 * 0.6666666666666666 * local_e0[lVar8 + -1];
                            lVar8 = lVar8 + 1;
                          } while (lVar8 != 3);
                          lVar8 = 0;
                          do {
                            local_1f8[lVar8] =
                                 (&local_b8)[lVar8] * (local_2e8[0] + local_2e8[0]) +
                                 (&local_b8)[lVar8 + 0xc] * (local_348[0] + local_348[0]) +
                                 (&local_b8)[lVar8 + 6] * (local_368[0] + local_368[0]);
                            lVar8 = lVar8 + 1;
                          } while (lVar8 != 3);
                          dVar11 = local_388 * local_388 +
                                   local_328[0] * local_328[0] +
                                   local_308[0] * local_308[0] +
                                   local_2e8[0] * local_2e8[0] +
                                   local_348[0] * local_348[0] + local_368[0] * local_368[0];
                          dVar12 = dVar11 * 1e+20;
                          if (dVar12 <= -dVar12) {
                            dVar12 = -dVar12;
                          }
                          dVar15 = -dVar14;
                          dVar10 = dVar14;
                          if (dVar14 <= dVar15) {
                            dVar10 = dVar15;
                          }
                          if (dVar10 < dVar12) {
                            *quality = (dVar14 * 24.9610058766228) / dVar11;
                            lVar8 = 0;
                            do {
                              d_quality[lVar8] =
                                   (((local_1d8[lVar8] * dVar11 + local_1f8[lVar8] * dVar15) *
                                    24.9610058766228) / dVar11) / dVar11;
                              lVar8 = lVar8 + 1;
                            } while (lVar8 != 3);
                            return 0;
                          }
                          goto LAB_00179c23;
                        }
                        pcVar9 = "n3";
                        uVar7 = 0x6cf;
                      }
                      else {
                        pcVar9 = "n2";
                        uVar7 = 0x6cb;
                      }
                    }
                    else {
                      pcVar9 = "n1";
                      uVar7 = 0x6c7;
                    }
                  }
                  else {
                    pcVar9 = "n0";
                    uVar7 = 0x6c3;
                  }
                }
                else {
                  pcVar9 = "vol";
                  uVar7 = 0x6ba;
                }
              }
              else {
                pcVar9 = "l5";
                uVar7 = 0x6b8;
              }
            }
            else {
              pcVar9 = "l4";
              uVar7 = 0x6b7;
            }
          }
          else {
            pcVar9 = "l3";
            uVar7 = 0x6b6;
          }
        }
        else {
          pcVar9 = "l2";
          uVar7 = 0x6b5;
        }
      }
      else {
        pcVar9 = "l1";
        uVar7 = 0x6b4;
      }
    }
    else {
      pcVar9 = "l0";
      uVar7 = 0x6b3;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar7,
           "ref_node_tet_epic_dquality_dnode0",(ulong)uVar6,pcVar9);
    pcVar9 = "epic";
    uVar7 = 0x751;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar7,
         "ref_node_tet_dquality_dnode0",(ulong)uVar6,pcVar9);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_node_tet_dquality_dnode0(REF_NODE ref_node,
                                                REF_INT *nodes,
                                                REF_DBL *quality,
                                                REF_DBL *d_quality) {
  switch (ref_node->tet_quality) {
    case REF_NODE_EPIC_QUALITY:
      RSS(ref_node_tet_epic_dquality_dnode0(ref_node, nodes, quality,
                                            d_quality),
          "epic");
      break;
    case REF_NODE_JAC_QUALITY:
      RSS(ref_node_tet_jac_dquality_dnode0(ref_node, nodes, quality, d_quality),
          "jac");
      break;
    default:
      THROW("case not recognized");
  }
  return REF_SUCCESS;
}